

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history_buffer.c
# Opt level: O2

void history_buffer_destroy(history_buffer *buf)

{
  uint i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < buf->cap; uVar1 = uVar1 + 1) {
    free(buf->history[uVar1]);
  }
  free(buf->history);
  free(buf->fetched);
  free(buf);
  return;
}

Assistant:

void history_buffer_destroy(history_buffer *buf) {
    for (unsigned int i = 0; i < buf->cap; i++) {
        free(buf->history[i]);
    }
    free(buf->history);
    free(buf->fetched);
    free(buf);
}